

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHsh.h
# Opt level: O0

Hsh_IntMan_t * Hsh_WrdManHashArrayStart(Vec_Wrd_t *vDataW,int nSize)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  int *__dest;
  word *__src;
  Hsh_IntMan_t *p_01;
  Vec_Int_t *vData;
  int nEntries;
  int i;
  Hsh_IntMan_t *p;
  int nSize_local;
  Vec_Wrd_t *vDataW_local;
  
  iVar1 = Vec_WrdSize(vDataW);
  iVar1 = iVar1 / nSize;
  iVar2 = Vec_WrdSize(vDataW);
  p_00 = Vec_IntAlloc(iVar2 << 1);
  __dest = Vec_IntArray(p_00);
  __src = Vec_WrdArray(vDataW);
  iVar2 = Vec_WrdSize(vDataW);
  memcpy(__dest,__src,(long)iVar2 << 3);
  iVar2 = Vec_WrdSize(vDataW);
  p_00->nSize = iVar2 << 1;
  iVar2 = Vec_IntSize(p_00);
  if (iVar2 % (nSize << 1) != 0) {
    __assert_fail("Vec_IntSize(vData) % (2*nSize) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecHsh.h"
                  ,0x186,"Hsh_IntMan_t *Hsh_WrdManHashArrayStart(Vec_Wrd_t *, int)");
  }
  p_01 = Hsh_IntManStart(p_00,nSize << 1,iVar1);
  for (vData._4_4_ = 0; vData._4_4_ < iVar1; vData._4_4_ = vData._4_4_ + 1) {
    Hsh_IntManAdd(p_01,vData._4_4_);
  }
  iVar2 = Vec_WrdSize(p_01->vObjs);
  if (iVar2 == iVar1) {
    return p_01;
  }
  __assert_fail("Vec_WrdSize(p->vObjs) == nEntries",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecHsh.h"
                ,0x18a,"Hsh_IntMan_t *Hsh_WrdManHashArrayStart(Vec_Wrd_t *, int)");
}

Assistant:

static inline Hsh_IntMan_t * Hsh_WrdManHashArrayStart( Vec_Wrd_t * vDataW, int nSize )
{
    Hsh_IntMan_t * p;
    int i, nEntries = Vec_WrdSize(vDataW) / nSize;
    Vec_Int_t * vData = Vec_IntAlloc( 2*Vec_WrdSize(vDataW) );
    memcpy( Vec_IntArray(vData), Vec_WrdArray(vDataW), sizeof(word)*(size_t)Vec_WrdSize(vDataW) );
    vData->nSize = 2*Vec_WrdSize(vDataW);
/*
    for ( i = 0; i < 30; i++ )
    {
        extern void Extra_PrintHex( FILE * pFile, unsigned * pTruth, int nVars );
        Extra_PrintHex( stdout, (unsigned *) Vec_WrdEntryP(vDataW, i), 6 );  printf( "  " );
        Kit_DsdPrintFromTruth( (unsigned *) Vec_WrdEntryP(vDataW, i), 6 );   printf( "\n" );
    }
*/
    assert( Vec_IntSize(vData) % (2*nSize) == 0 );
    p = Hsh_IntManStart( vData, (2*nSize), nEntries );
    for ( i = 0; i < nEntries; i++ )
        Hsh_IntManAdd( p, i );
    assert( Vec_WrdSize(p->vObjs) == nEntries );
    return p;
}